

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O0

void duckdb::ComputeListEntrySizes
               (Vector *v,UnifiedVectorFormat *vdata,idx_t *entry_sizes,idx_t ser_count,
               SelectionVector *sel,idx_t offset)

{
  bool bVar1;
  PhysicalType type;
  list_entry_t *plVar2;
  idx_t offset_00;
  idx_t iVar3;
  LogicalType *this;
  TemplatedValidityMask<unsigned_long> *pTVar4;
  SelectionVector *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  Vector *in_RDI;
  SelectionVector *in_R8;
  long in_R9;
  idx_t list_idx;
  unsigned_long next;
  uint64_t entry_offset;
  uint64_t entry_remaining;
  list_entry_t list_entry;
  idx_t source_idx;
  idx_t idx;
  idx_t i;
  idx_t list_entry_sizes [2048];
  Vector *child_vector;
  list_entry_t *list_data;
  Vector *in_stack_ffffffffffffbf48;
  LogicalType *in_stack_ffffffffffffbf50;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffbf58;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffbf60;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffbf68;
  uint in_stack_ffffffffffffbf70;
  unsigned_long local_4078;
  SelectionVector *sel_00;
  idx_t in_stack_ffffffffffffbfb8;
  element_type *in_stack_ffffffffffffbfc0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffbfc8;
  Vector *in_stack_ffffffffffffbfd0;
  
  plVar2 = ListVector::GetData(in_stack_ffffffffffffbf48);
  ListVector::GetEntry((Vector *)0x1596b09);
  for (sel_00 = (SelectionVector *)0x0; sel_00 < in_RCX;
      sel_00 = (SelectionVector *)((long)&sel_00->sel_vector + 1)) {
    offset_00 = SelectionVector::get_index(in_R8,(idx_t)sel_00);
    iVar3 = SelectionVector::get_index((SelectionVector *)*in_RSI,offset_00 + in_R9);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffbf58,(idx_t)in_stack_ffffffffffffbf50);
    if (bVar1) {
      local_4078 = plVar2[iVar3].length;
      *(long *)(in_RDX + (long)sel_00 * 8) = *(long *)(in_RDX + (long)sel_00 * 8) + 8;
      *(unsigned_long *)(in_RDX + (long)sel_00 * 8) =
           (local_4078 + 7 >> 3) + *(long *)(in_RDX + (long)sel_00 * 8);
      Vector::GetType(in_RDI);
      this = ListType::GetChildType(in_stack_ffffffffffffbf50);
      type = LogicalType::InternalType(this);
      bVar1 = TypeIsConstantSize(type);
      if (!bVar1) {
        *(unsigned_long *)(in_RDX + (long)sel_00 * 8) =
             local_4078 * 8 + *(long *)(in_RDX + (long)sel_00 * 8);
      }
      for (; local_4078 != 0; local_4078 = local_4078 - (long)pTVar4) {
        pTVar4 = (TemplatedValidityMask<unsigned_long> *)MinValue<unsigned_long>(0x800,local_4078);
        ::std::fill_n<unsigned_long*,unsigned_long,int>
                  ((unsigned_long *)(ulong)in_stack_ffffffffffffbf70,
                   (unsigned_long)in_stack_ffffffffffffbf68,(int *)in_stack_ffffffffffffbf60);
        in_stack_ffffffffffffbf50 = (LogicalType *)&stack0xffffffffffffbfb8;
        in_stack_ffffffffffffbf58 = pTVar4;
        in_stack_ffffffffffffbf60 = pTVar4;
        FlatVector::IncrementalSelectionVector();
        RowOperations::ComputeEntrySizes
                  (in_stack_ffffffffffffbfd0,(idx_t *)in_stack_ffffffffffffbfc8._M_pi,
                   (idx_t)in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfb8,sel_00,offset_00);
        for (in_stack_ffffffffffffbf68 = (TemplatedValidityMask<unsigned_long> *)0x0;
            in_stack_ffffffffffffbf68 < pTVar4;
            in_stack_ffffffffffffbf68 =
                 (TemplatedValidityMask<unsigned_long> *)
                 ((long)&in_stack_ffffffffffffbf68->validity_mask + 1)) {
          *(long *)(in_RDX + (long)sel_00 * 8) =
               *(long *)(&stack0xffffffffffffbfb8 + (long)in_stack_ffffffffffffbf68 * 8) +
               *(long *)(in_RDX + (long)sel_00 * 8);
        }
      }
    }
  }
  return;
}

Assistant:

static void ComputeListEntrySizes(Vector &v, UnifiedVectorFormat &vdata, idx_t entry_sizes[], idx_t ser_count,
                                  const SelectionVector &sel, idx_t offset) {
	auto list_data = ListVector::GetData(v);
	auto &child_vector = ListVector::GetEntry(v);
	idx_t list_entry_sizes[STANDARD_VECTOR_SIZE];
	for (idx_t i = 0; i < ser_count; i++) {
		auto idx = sel.get_index(i);
		auto source_idx = vdata.sel->get_index(idx + offset);
		if (vdata.validity.RowIsValid(source_idx)) {
			auto list_entry = list_data[source_idx];

			// make room for list length, list validitymask
			entry_sizes[i] += sizeof(list_entry.length);
			entry_sizes[i] += (list_entry.length + 7) / 8;

			// serialize size of each entry (if non-constant size)
			if (!TypeIsConstantSize(ListType::GetChildType(v.GetType()).InternalType())) {
				entry_sizes[i] += list_entry.length * sizeof(list_entry.length);
			}

			// compute size of each the elements in list_entry and sum them
			auto entry_remaining = list_entry.length;
			auto entry_offset = list_entry.offset;
			while (entry_remaining > 0) {
				// the list entry can span multiple vectors
				auto next = MinValue((idx_t)STANDARD_VECTOR_SIZE, entry_remaining);

				// compute and add to the total
				std::fill_n(list_entry_sizes, next, 0);
				RowOperations::ComputeEntrySizes(child_vector, list_entry_sizes, next, next,
				                                 *FlatVector::IncrementalSelectionVector(), entry_offset);
				for (idx_t list_idx = 0; list_idx < next; list_idx++) {
					entry_sizes[i] += list_entry_sizes[list_idx];
				}

				// update for next iteration
				entry_remaining -= next;
				entry_offset += next;
			}
		}
	}
}